

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

ndicapi * ndiOpenSerial(char *device)

{
  int serial_port;
  int iVar1;
  ndicapi *pnVar2;
  size_t sVar3;
  char *__dest;
  char *__s;
  char *__s_00;
  char *__s_01;
  undefined1 auVar4 [16];
  
  serial_port = ndiSerialOpen(device);
  if (serial_port != -1) {
    iVar1 = ndiSerialComm(serial_port,0x2580,"8N1",0);
    if (((-1 < iVar1) && (iVar1 = ndiSerialFlush(serial_port,3), -1 < iVar1)) &&
       (pnVar2 = (ndicapi *)calloc(1,0x4588), pnVar2 != (ndicapi *)0x0)) {
      pnVar2->SerialDevice = serial_port;
      sVar3 = strlen(device);
      __dest = (char *)malloc(sVar3 + 1);
      pnVar2->SerialDeviceName = __dest;
      __s = (char *)malloc(0x800);
      pnVar2->Command = __s;
      __s_00 = (char *)malloc(0x800);
      pnVar2->Reply = __s_00;
      __s_01 = (char *)malloc(0x800);
      pnVar2->ReplyNoCRC = __s_01;
      pnVar2->Port = -1;
      pnVar2->Socket = -1;
      auVar4._0_4_ = -(uint)((int)((ulong)__dest >> 0x20) == 0 && (int)__dest == 0);
      auVar4._4_4_ = -(uint)((int)__s == 0 && (int)((ulong)__s >> 0x20) == 0);
      auVar4._8_4_ = -(uint)((int)((ulong)__s_00 >> 0x20) == 0 && (int)__s_00 == 0);
      auVar4._12_4_ = -(uint)((int)__s_01 == 0 && (int)((ulong)__s_01 >> 0x20) == 0);
      iVar1 = movmskps((int)__s_01,auVar4);
      if (iVar1 == 0) {
        strcpy(__dest,device);
        memset(__s,0,0x800);
        memset(__s_00,0,0x800);
        memset(__s_01,0,0x800);
        return pnVar2;
      }
      free(__dest);
      free(__s);
      free(__s_00);
      free(__s_01);
    }
    ndiSerialClose(serial_port);
  }
  return (ndicapi *)0x0;
}

Assistant:

ndicapiExport ndicapi* ndiOpenSerial(const char* device)
{
  NDIFileHandle serial_port;
  ndicapi* pol;

  serial_port = ndiSerialOpen(device);

  if (serial_port == NDI_INVALID_HANDLE)
  {
    return NULL;
  }

  if (ndiSerialComm(serial_port, 9600, "8N1", 0) < 0)
  {
    ndiSerialClose(serial_port);
    return NULL;
  }

  if (ndiSerialFlush(serial_port, NDI_IOFLUSH) < 0)
  {
    ndiSerialClose(serial_port);
    return NULL;
  }

  pol = (ndicapi*)malloc(sizeof(ndicapi));

  if (pol == 0)
  {
    ndiSerialClose(serial_port);
    return NULL;
  }

  memset(pol, 0, sizeof(ndicapi));
  pol->SerialDevice = serial_port;

  // allocate the buffers
  pol->SerialDeviceName = (char*)malloc(strlen(device) + 1);
  pol->Command = (char*)malloc(2048);
  pol->Reply = (char*)malloc(2048);
  pol->ReplyNoCRC = (char*)malloc(2048);
  pol->Hostname = NULL;
  pol->Port = -1;
  pol->Socket = -1;

  if (pol->SerialDeviceName == 0 || pol->Command == 0 || pol->Reply == 0 || pol->ReplyNoCRC == 0)
  {
    if (pol->SerialDeviceName)
    {
      free(pol->SerialDeviceName);
    }
    if (pol->Command)
    {
      free(pol->Command);
    }
    if (pol->Reply)
    {
      free(pol->Reply);
    }
    if (pol->ReplyNoCRC)
    {
      free(pol->ReplyNoCRC);
    }

    ndiSerialClose(serial_port);
    return NULL;
  }

  // initialize the allocated memory
  strcpy(pol->SerialDeviceName, device);
  memset(pol->Command, 0, 2048);
  memset(pol->Reply, 0, 2048);
  memset(pol->ReplyNoCRC, 0, 2048);

  return pol;
}